

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O0

bool spvtools::val::anon_unknown_0::hasDecoration
               (uint32_t id,Decoration decoration,ValidationState_t *vstate)

{
  bool bVar1;
  Decoration DVar2;
  Op OVar3;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *this;
  reference this_00;
  Instruction *this_01;
  reference puVar4;
  int local_74;
  uint member_id;
  iterator __end2_1;
  iterator __begin2_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2_1;
  Decoration *dec;
  iterator __end2;
  iterator __begin2;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *__range2;
  ValidationState_t *vstate_local;
  Decoration decoration_local;
  uint32_t id_local;
  
  this = ValidationState_t::id_decorations(vstate,id);
  __end2 = std::
           set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
           ::begin(this);
  dec = (Decoration *)
        std::
        set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
        ::end(this);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&dec);
    if (!bVar1) break;
    this_00 = std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator*(&__end2);
    DVar2 = Decoration::dec_type(this_00);
    if (decoration == DVar2) {
      decoration_local._3_1_ = 1;
      goto LAB_00b048ea;
    }
    std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator++(&__end2);
  }
  this_01 = ValidationState_t::FindDef(vstate,id);
  OVar3 = val::Instruction::opcode(this_01);
  if (OVar3 == OpTypeStruct) {
    getStructMembers((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__begin2_1,id,
                     OpTypeStruct,vstate);
    __end2_1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__begin2_1);
    _member_id = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__begin2_1);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2_1,
                         (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)&member_id);
      if (!bVar1) break;
      puVar4 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&__end2_1);
      bVar1 = hasDecoration(*puVar4,decoration,vstate);
      if (bVar1) {
        decoration_local._3_1_ = 1;
        local_74 = 1;
        goto LAB_00b048d3;
      }
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      operator++(&__end2_1);
    }
    local_74 = 4;
LAB_00b048d3:
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__begin2_1);
    if (local_74 != 1) {
      decoration_local._3_1_ = DecorationRelaxedPrecision >> 0x18;
    }
  }
  else {
    decoration_local._3_1_ = DecorationRelaxedPrecision >> 0x18;
  }
LAB_00b048ea:
  return (bool)(decoration_local._3_1_ & 1);
}

Assistant:

bool hasDecoration(uint32_t id, spv::Decoration decoration,
                   ValidationState_t& vstate) {
  for (auto& dec : vstate.id_decorations(id)) {
    if (decoration == dec.dec_type()) return true;
  }
  if (spv::Op::OpTypeStruct != vstate.FindDef(id)->opcode()) {
    return false;
  }
  for (auto member_id : getStructMembers(id, spv::Op::OpTypeStruct, vstate)) {
    if (hasDecoration(member_id, decoration, vstate)) {
      return true;
    }
  }
  return false;
}